

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O0

UniValue * rpc_tests::ValueFromString(string *str)

{
  long lVar1;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  UniValue *value;
  UniValue *in_stack_ffffffffffffffa8;
  string *in_stack_ffffffffffffffe0;
  UniValue *in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniValue::UniValue(in_stack_ffffffffffffffa8);
  std::__cxx11::string::string
            (in_stack_fffffffffffffff0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffffe8);
  UniValue::setNumStr(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffffa8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

static UniValue ValueFromString(const std::string& str) noexcept
{
    UniValue value;
    value.setNumStr(str);
    return value;
}